

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pushdown_window.cpp
# Opt level: O2

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::FilterPushdown::PushdownWindow
          (FilterPushdown *this,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *op)

{
  vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>_>_>
  *this_00;
  pointer puVar1;
  pointer puVar2;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var3;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var4;
  undefined8 uVar5;
  bool bVar6;
  pointer pLVar7;
  LogicalWindow *pLVar8;
  pointer pEVar9;
  BoundWindowExpression *pBVar10;
  BoundColumnRefExpression *pBVar11;
  reference this_01;
  pointer pFVar12;
  type expr;
  unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>
  *__args;
  reference pvVar13;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *in_RDX;
  iterator __end2;
  ulong __n;
  FilterPushdown *this_02;
  iterator __begin2;
  pointer this_03;
  pointer this_04;
  vector<duckdb::ColumnBinding,_true> bindings;
  vector<std::unordered_set<duckdb::ColumnBinding,_duckdb::ColumnBindingHashFunction,_duckdb::ColumnBindingEquality,_std::allocator<duckdb::ColumnBinding>_>,_true>
  window_exprs_partition_bindings;
  vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_true>
  leftover_filters;
  FilterPushdown pushdown;
  undefined1 local_1e8 [64];
  undefined1 local_1a8 [64];
  vector<std::unordered_set<duckdb::ColumnBinding,_duckdb::ColumnBindingHashFunction,_duckdb::ColumnBindingEquality,_std::allocator<duckdb::ColumnBinding>_>,_std::allocator<std::unordered_set<duckdb::ColumnBinding,_duckdb::ColumnBindingHashFunction,_duckdb::ColumnBindingEquality,_std::allocator<duckdb::ColumnBinding>_>_>_>
  local_168;
  FilterPushdown local_150;
  
  pLVar7 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(in_RDX);
  pLVar8 = LogicalOperator::Cast<duckdb::LogicalWindow>(pLVar7);
  local_1e8._24_8_ = &local_150;
  FilterPushdown((FilterPushdown *)local_1e8._24_8_,
                 (Optimizer *)
                 (op->
                 super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                 .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl,
                 *(bool *)&op[0x20].
                           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                           ._M_t.
                           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl);
  local_1e8._32_8_ = (pointer)0x0;
  local_1e8._40_8_ = (pointer)0x0;
  local_1e8._48_8_ = 0;
  this_04 = (pLVar8->super_LogicalOperator).expressions.
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (pLVar8->super_LogicalOperator).expressions.
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (this_04 == puVar1) {
      if (local_1e8._32_8_ == local_1e8._40_8_) {
        _Var4._M_head_impl =
             (in_RDX->
             super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
             .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
        (in_RDX->
        super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
        _M_t.
        super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
        .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
             (LogicalOperator *)0x0;
        FinishPushdown(this,op);
        if (_Var4._M_head_impl != (LogicalOperator *)0x0) {
          (**(code **)((long)(_Var4._M_head_impl)->_vptr_LogicalOperator + 8))();
        }
      }
      else {
        local_1a8._16_8_ = (pointer)0x0;
        local_1a8._0_8_ = (Optimizer *)0x0;
        local_1a8._8_8_ = (ClientContext *)0x0;
        this_00 = (vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>_>_>
                   *)(op + 0x21);
        local_1e8._24_8_ = local_1e8._24_8_ + 0x108;
        for (__n = 0; __n < (ulong)((long)op[0x22].
                                          super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                          ._M_t.
                                          super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                                          .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>.
                                          _M_head_impl -
                                    (long)op[0x21].
                                          super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                          ._M_t.
                                          super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                                          .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>.
                                          _M_head_impl >> 3); __n = __n + 1) {
          local_1e8._0_8_ = (LogicalOperator *)0x0;
          local_1e8._8_8_ = (ClientContext *)0x0;
          local_1e8._16_8_ = (pointer)0x0;
          this_01 = ::std::
                    vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>_>_>
                    ::at(this_00,__n);
          pFVar12 = unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>
                    ::operator->(this_01);
          expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator*(&pFVar12->filter);
          ExtractFilterBindings
                    ((FilterPushdown *)op,expr,(vector<duckdb::ColumnBinding,_true> *)local_1e8);
          ::std::
          vector<std::unordered_set<duckdb::ColumnBinding,_duckdb::ColumnBindingHashFunction,_duckdb::ColumnBindingEquality,_std::allocator<duckdb::ColumnBinding>_>,_std::allocator<std::unordered_set<duckdb::ColumnBinding,_duckdb::ColumnBindingHashFunction,_duckdb::ColumnBindingEquality,_std::allocator<duckdb::ColumnBinding>_>_>_>
          ::vector(&local_168,
                   (vector<std::unordered_set<duckdb::ColumnBinding,_duckdb::ColumnBindingHashFunction,_duckdb::ColumnBindingEquality,_std::allocator<duckdb::ColumnBinding>_>,_std::allocator<std::unordered_set<duckdb::ColumnBinding,_duckdb::ColumnBindingHashFunction,_duckdb::ColumnBindingEquality,_std::allocator<duckdb::ColumnBinding>_>_>_>
                    *)(local_1e8 + 0x20));
          bVar6 = CanPushdownFilter((vector<std::unordered_set<duckdb::ColumnBinding,_duckdb::ColumnBindingHashFunction,_duckdb::ColumnBindingEquality,_std::allocator<duckdb::ColumnBinding>_>,_true>
                                     *)&local_168,(vector<duckdb::ColumnBinding,_true> *)local_1e8);
          ::std::
          vector<std::unordered_set<duckdb::ColumnBinding,_duckdb::ColumnBindingHashFunction,_duckdb::ColumnBindingEquality,_std::allocator<duckdb::ColumnBinding>_>,_std::allocator<std::unordered_set<duckdb::ColumnBinding,_duckdb::ColumnBindingHashFunction,_duckdb::ColumnBindingEquality,_std::allocator<duckdb::ColumnBinding>_>_>_>
          ::~vector(&local_168);
          if (bVar6) {
            __args = ::std::
                     vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>_>_>
                     ::at(this_00,__n);
            this_02 = (FilterPushdown *)local_1e8._24_8_;
          }
          else {
            __args = ::std::
                     vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>_>_>
                     ::at(this_00,__n);
            this_02 = (FilterPushdown *)local_1a8;
          }
          ::std::
          vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,std::default_delete<duckdb::FilterPushdown::Filter>,true>,std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,std::default_delete<duckdb::FilterPushdown::Filter>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,std::default_delete<duckdb::FilterPushdown::Filter>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,std::default_delete<duckdb::FilterPushdown::Filter>,true>,std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,std::default_delete<duckdb::FilterPushdown::Filter>,true>>>
                      *)this_02,__args);
          ::std::_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::
          ~_Vector_base((_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                         *)local_1e8);
        }
        pLVar7 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                 ::operator->(in_RDX);
        pvVar13 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                  ::get<true>(&pLVar7->children,0);
        _Var4._M_head_impl =
             (pvVar13->
             super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
             .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
        (pvVar13->
        super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
        _M_t.
        super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
        .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
             (LogicalOperator *)0x0;
        Rewrite((FilterPushdown *)local_1e8,
                (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                 *)&local_150);
        pLVar7 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                 ::operator->(in_RDX);
        pvVar13 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                  ::get<true>(&pLVar7->children,0);
        uVar5 = local_1e8._0_8_;
        local_1e8._0_8_ = (Optimizer *)0x0;
        _Var3._M_head_impl =
             (pvVar13->
             super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
             .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
        (pvVar13->
        super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
        _M_t.
        super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
        .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
             (LogicalOperator *)uVar5;
        if (_Var3._M_head_impl != (LogicalOperator *)0x0) {
          (**(code **)((long)(_Var3._M_head_impl)->_vptr_LogicalOperator + 8))();
        }
        if ((Optimizer *)local_1e8._0_8_ != (Optimizer *)0x0) {
          (*(code *)((*(ClientContext **)local_1e8._0_8_)->
                    super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
                    super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi)();
        }
        local_1e8._0_8_ = (LogicalOperator *)0x0;
        if (_Var4._M_head_impl != (LogicalOperator *)0x0) {
          (**(code **)((long)(_Var4._M_head_impl)->_vptr_LogicalOperator + 8))();
        }
        ::std::
        vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>_>_>
        ::_M_move_assign(this_00,local_1a8);
        _Var4._M_head_impl =
             (in_RDX->
             super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
             .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
        (in_RDX->
        super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
        _M_t.
        super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
        .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
             (LogicalOperator *)0x0;
        FinishPushdown(this,op);
        if (_Var4._M_head_impl != (LogicalOperator *)0x0) {
          (**(code **)((long)(_Var4._M_head_impl)->_vptr_LogicalOperator + 8))();
        }
        ::std::
        vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>_>_>
                   *)local_1a8);
      }
LAB_012385b1:
      ::std::
      vector<std::unordered_set<duckdb::ColumnBinding,_duckdb::ColumnBindingHashFunction,_duckdb::ColumnBindingEquality,_std::allocator<duckdb::ColumnBinding>_>,_std::allocator<std::unordered_set<duckdb::ColumnBinding,_duckdb::ColumnBindingHashFunction,_duckdb::ColumnBindingEquality,_std::allocator<duckdb::ColumnBinding>_>_>_>
      ::~vector((vector<std::unordered_set<duckdb::ColumnBinding,_duckdb::ColumnBindingHashFunction,_duckdb::ColumnBindingEquality,_std::allocator<duckdb::ColumnBinding>_>,_std::allocator<std::unordered_set<duckdb::ColumnBinding,_duckdb::ColumnBindingHashFunction,_duckdb::ColumnBindingEquality,_std::allocator<duckdb::ColumnBinding>_>_>_>
                 *)(local_1e8 + 0x20));
      ~FilterPushdown(&local_150);
      return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
             (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
             this;
    }
    pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(this_04);
    if ((pEVar9->super_BaseExpression).expression_class == BOUND_WINDOW) {
      pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(this_04);
      pBVar10 = BaseExpression::Cast<duckdb::BoundWindowExpression>(&pEVar9->super_BaseExpression);
      this_03 = (pBVar10->partitions).
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar2 = (pBVar10->partitions).
               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (this_03 == puVar2) {
        _Var4._M_head_impl =
             (in_RDX->
             super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
             .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
        (in_RDX->
        super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
        _M_t.
        super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
        .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
             (LogicalOperator *)0x0;
        FinishPushdown(this,op);
        if (_Var4._M_head_impl != (LogicalOperator *)0x0) {
          (**(code **)((long)(_Var4._M_head_impl)->_vptr_LogicalOperator + 8))();
        }
        goto LAB_012385b1;
      }
      local_1a8._8_8_ = (ClientContext *)0x1;
      local_1a8._16_8_ = (pointer)0x0;
      local_1a8._24_8_ = (__node_base_ptr)0x0;
      local_1a8._32_4_ = 0x3f800000;
      local_1a8._40_8_ = (__buckets_ptr)0x0;
      local_1a8._48_8_ = (_Hash_node_base *)0x0;
      local_1a8._0_8_ = (Optimizer *)(local_1a8 + 0x30);
      for (; this_03 != puVar2; this_03 = this_03 + 1) {
        pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(this_03);
        if ((pEVar9->super_BaseExpression).type == BOUND_COLUMN_REF) {
          pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator->(this_03);
          pBVar11 = BaseExpression::Cast<duckdb::BoundColumnRefExpression>
                              (&pEVar9->super_BaseExpression);
          ::std::__detail::
          _Insert_base<duckdb::ColumnBinding,_duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>,_std::__detail::_Identity,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::insert((_Insert_base<duckdb::ColumnBinding,_duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>,_std::__detail::_Identity,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    *)local_1a8,&pBVar11->binding);
        }
      }
      ::std::
      vector<std::unordered_set<duckdb::ColumnBinding,_duckdb::ColumnBindingHashFunction,_duckdb::ColumnBindingEquality,_std::allocator<duckdb::ColumnBinding>_>,_std::allocator<std::unordered_set<duckdb::ColumnBinding,_duckdb::ColumnBindingHashFunction,_duckdb::ColumnBindingEquality,_std::allocator<duckdb::ColumnBinding>_>_>_>
      ::push_back((vector<std::unordered_set<duckdb::ColumnBinding,_duckdb::ColumnBindingHashFunction,_duckdb::ColumnBindingEquality,_std::allocator<duckdb::ColumnBinding>_>,_std::allocator<std::unordered_set<duckdb::ColumnBinding,_duckdb::ColumnBindingHashFunction,_duckdb::ColumnBindingEquality,_std::allocator<duckdb::ColumnBinding>_>_>_>
                   *)(local_1e8 + 0x20),(value_type *)local_1a8);
      ::std::
      _Hashtable<duckdb::ColumnBinding,_duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>,_std::__detail::_Identity,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable((_Hashtable<duckdb::ColumnBinding,_duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>,_std::__detail::_Identity,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)local_1a8);
    }
    this_04 = this_04 + 1;
  } while( true );
}

Assistant:

unique_ptr<LogicalOperator> FilterPushdown::PushdownWindow(unique_ptr<LogicalOperator> op) {
	D_ASSERT(op->type == LogicalOperatorType::LOGICAL_WINDOW);
	auto &window = op->Cast<LogicalWindow>();
	FilterPushdown pushdown(optimizer, convert_mark_joins);

	// 1. Loop throguh the expressions, find the window expressions and investigate the partitions
	// if a filter applies to a partition in each window expression then you can push the filter
	// into the children.
	vector<column_binding_set_t> window_exprs_partition_bindings;
	for (auto &expr : window.expressions) {
		if (expr->GetExpressionClass() != ExpressionClass::BOUND_WINDOW) {
			continue;
		}
		auto &window_expr = expr->Cast<BoundWindowExpression>();
		auto &partitions = window_expr.partitions;
		if (partitions.empty()) {
			// If any window expression does not have partitions, we cannot push any filters.
			// all window expressions need to be partitioned by the same column
			// in order to push down the window.
			return FinishPushdown(std::move(op));
		}
		column_binding_set_t partition_bindings;
		// 2. Get the binding information of the partitions of the window expression
		for (auto &partition_expr : partitions) {
			switch (partition_expr->GetExpressionType()) {
			// TODO: Add expressions for function expressions like FLOOR, CEIL etc.
			case ExpressionType::BOUND_COLUMN_REF: {
				auto &partition_col = partition_expr->Cast<BoundColumnRefExpression>();
				partition_bindings.insert(partition_col.binding);
				break;
			}
			default:
				break;
			}
		}
		window_exprs_partition_bindings.push_back(partition_bindings);
	}

	if (window_exprs_partition_bindings.empty()) {
		return FinishPushdown(std::move(op));
	}

	vector<unique_ptr<Filter>> leftover_filters;
	// Loop through the filters. If a filter is on a partition in every window expression
	// it can be pushed down.
	for (idx_t i = 0; i < filters.size(); i++) {
		// the filter must be on all partition bindings
		vector<ColumnBinding> bindings;
		ExtractFilterBindings(*filters.at(i)->filter, bindings);
		if (CanPushdownFilter(window_exprs_partition_bindings, bindings)) {
			pushdown.filters.push_back(std::move(filters.at(i)));
		} else {
			leftover_filters.push_back(std::move(filters.at(i)));
		}
	}
	op->children[0] = pushdown.Rewrite(std::move(op->children[0]));
	filters = std::move(leftover_filters);
	return FinishPushdown(std::move(op));
}